

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCACore.cpp
# Opt level: O0

bool __thiscall Js::SCACore::Serializer::WriteValue(Serializer *this,Var rootObject)

{
  ScriptContext *scriptContext_00;
  void *unaff_retaddr;
  undefined1 local_90 [8];
  EnterScriptObject __enterScriptObject;
  ScriptEntryExitRecord __entryExitRecord;
  ScriptContext *__localScriptContext;
  ScriptContext *scriptContext;
  Var rootObject_local;
  Serializer *this_local;
  
  scriptContext_00 = ScriptContextHolder::GetScriptContext((ScriptContextHolder *)this);
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_90,scriptContext_00,
             (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,&stack0x00000000,
             true,false,false);
  ScriptContext::OnScriptStart(scriptContext_00,false,true);
  EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_90);
  SCASerializationEngine::Serialize
            (rootObject,&this->m_streamWriter,this->m_transferableVars,this->m_cTransferableVars,
             (List<Js::SharedContents_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)0x0);
  EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_90);
  return true;
}

Assistant:

bool Serializer::WriteValue(Var rootObject)
        {
            ScriptContext *scriptContext = m_streamWriter.GetScriptContext();
            BEGIN_JS_RUNTIME_CALL(scriptContext)
            {
                Js::SCASerializationEngine::Serialize(rootObject, &m_streamWriter, m_transferableVars, m_cTransferableVars, nullptr /*TBD*/);
            }
            END_JS_RUNTIME_CALL(scriptContext)
                return true;
        }